

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O2

void csp_eth_pbuf_cleanup(csp_eth_interface_data_t *ifdata,uint32_t now,int *task_woken)

{
  csp_packet_t *packet;
  csp_packet_t *pcVar1;
  csp_packet_s **ppcVar2;
  
  pcVar1 = (csp_packet_t *)0x0;
  ppcVar2 = &ifdata->pbufs;
  while (packet = *ppcVar2, packet != (csp_packet_t *)0x0) {
    if (1000 < now - packet->last_used) {
      ppcVar2 = &pcVar1->next;
      if (pcVar1 == (csp_packet_t *)0x0) {
        ppcVar2 = &ifdata->pbufs;
      }
      *ppcVar2 = packet->next;
      if (task_woken == (int *)0x0) {
        csp_buffer_free(packet);
      }
      else {
        csp_buffer_free_isr(packet);
      }
    }
    pcVar1 = packet;
    ppcVar2 = &packet->next;
  }
  return;
}

Assistant:

void csp_eth_pbuf_cleanup(csp_eth_interface_data_t * ifdata, uint32_t now, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if ((now - packet->last_used) > PBUF_TIMEOUT_MS) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (task_woken == NULL) {
				csp_buffer_free(packet);
			} else {
				csp_buffer_free_isr(packet);
			}

		}

		prev = packet;
		packet = packet->next;
	}

}